

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::iterate(MutableRenderBufferTest *this)

{
  Library *egl;
  char *description;
  deUint32 dVar1;
  int iVar2;
  qpTestResult testResult;
  TestContext *this_00;
  int iVar3;
  float fVar4;
  deUint32 backBufferPixel;
  int local_2c;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  dVar1 = 1;
  do {
    drawAndSwap(this,egl,dVar1,false);
    dVar1 = dVar1 + 1;
  } while (dVar1 != 5);
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3086,0x3085);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0xe7);
  drawAndSwap(this,egl,5,false);
  iVar2 = 6;
  iVar3 = 0x5050505;
  do {
    local_2c = -1;
    fVar4 = (float)iVar2 / 255.0;
    (*(this->m_gl).clearColor)(fVar4,fVar4,fVar4,fVar4);
    (*(this->m_gl).clear)(0x4000);
    (*(this->m_gl).flush)();
    (*(this->m_gl).readPixels)(0,0,1,1,0x1908,0x1401,&local_2c);
    iVar3 = iVar3 + 0x1010101;
    if (iVar3 != local_2c) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Surface isn\'t single-buffered";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00236f20;
    }
    iVar2 = iVar2 + 1;
  } while (iVar3 != 0x9090909);
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3086,0x3084);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0xfd);
  dVar1 = 10;
  do {
    drawAndSwap(this,egl,dVar1,false);
    dVar1 = dVar1 + 1;
  } while (dVar1 != 0xe);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00236f20:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

TestCase::IterateResult MutableRenderBufferTest::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	int frameNumber = 1;

	// run a few back-buffered frames even if we can't verify their contents
	for (; frameNumber < 5; frameNumber++)
	{
		drawAndSwap(egl, frameNumber, false);
	}

	// switch to single-buffer rendering
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER));

	// Use eglSwapBuffers for the first frame
	drawAndSwap(egl, frameNumber, false);
	frameNumber++;

	// test a few single-buffered frames
	for (; frameNumber < 10; frameNumber++)
	{
		deUint32 backBufferPixel = 0xFFFFFFFF;
		deUint32 frontBufferPixel = drawAndSwap(egl, frameNumber, true);
		m_gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &backBufferPixel);

		// when single buffered, front-buffer == back-buffer
		if (backBufferPixel != frontBufferPixel)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface isn't single-buffered");
			return STOP;
		}
	}

	// switch back to back-buffer rendering
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER));

	// run a few back-buffered frames even if we can't verify their contents
	for (; frameNumber < 14; frameNumber++)
	{
		drawAndSwap(egl, frameNumber, false);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}